

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O1

uchar __thiscall
sparse_square_matrix<unsigned_char>::get
          (sparse_square_matrix<unsigned_char> *this,uint32_t i,uint32_t j)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  uchar uVar5;
  _Hash_node_base *p_Var6;
  __hash_code __code;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  
  uVar1 = this->N;
  if (uVar1 <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
                 );
  }
  if (uVar1 <= j) {
    __assert_fail("j < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x3a,
                  "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
                 );
  }
  puVar2 = (this->denseStorage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 == (this->denseStorage).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    p_Var6 = (_Hash_node_base *)(ulong)(uVar1 * i + j);
    uVar3 = (this->sparseStorage)._M_h._M_bucket_count;
    uVar7 = (ulong)p_Var6 % uVar3;
    p_Var8 = (this->sparseStorage)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var8->_M_nxt[1]._M_nxt != p_Var6)) {
      while (p_Var8 = p_Var4, p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar7) ||
           (p_Var9 = p_Var8, p_Var4[1]._M_nxt == p_Var6)) goto LAB_0066f4bd;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_0066f4bd:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var9->_M_nxt;
    }
    if (p_Var6 == (_Hash_node_base *)0x0) {
      uVar5 = '\0';
    }
    else {
      uVar5 = *(uchar *)&p_Var6[2]._M_nxt;
    }
  }
  else {
    uVar5 = puVar2[uVar1 * i + j];
  }
  return uVar5;
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }